

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

void __thiscall cmOrderDirectories::CollectOriginalDirectories(cmOrderDirectories *this)

{
  pointer ppcVar1;
  cmOrderDirectoriesConstraint *pcVar2;
  int iVar3;
  pointer ppcVar4;
  
  AddOriginalDirectories(this,&this->UserDirectories);
  ppcVar1 = (this->ConstraintEntries).
            super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar4 = (this->ConstraintEntries).
                 super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1;
      ppcVar4 = ppcVar4 + 1) {
    pcVar2 = *ppcVar4;
    iVar3 = AddOriginalDirectory(pcVar2->OD,&pcVar2->Directory);
    pcVar2->DirectoryIndex = iVar3;
  }
  AddOriginalDirectories(this,&this->LanguageDirectories);
  return;
}

Assistant:

void cmOrderDirectories::CollectOriginalDirectories()
{
  // Add user directories specified for inclusion.  These should be
  // indexed first so their original order is preserved as much as
  // possible subject to the constraints.
  this->AddOriginalDirectories(this->UserDirectories);

  // Add directories containing constraints.
  for (cmOrderDirectoriesConstraint* entry : this->ConstraintEntries) {
    entry->AddDirectory();
  }

  // Add language runtime directories last.
  this->AddOriginalDirectories(this->LanguageDirectories);
}